

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

void __thiscall HighsDomain::changeBound(HighsDomain *this,HighsDomainChange boundchg,Reason reason)

{
  double *pdVar1;
  bool bVar2;
  long lVar3;
  undefined4 uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  HighsInt prevPos;
  double oldbound;
  HighsDomainChange local_40;
  int local_2c;
  double local_28;
  Reason local_20;
  
  local_40._8_8_ = boundchg._8_8_;
  local_40.boundval = boundchg.boundval;
  lVar3 = (long)boundchg.column;
  iVar6 = reason.type;
  if ((ulong)local_40._8_8_ >> 0x20 == 0) {
    dVar8 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar3];
    if ((local_40.boundval <= dVar8) && (local_40.boundval = dVar8, iVar6 != -1)) {
      return;
    }
    dVar9 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar3];
    lVar5 = 0x290;
    if (local_40.boundval <= dVar9) goto LAB_0029f4ce;
    pdVar1 = &((this->mipsolver->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
    if (local_40.boundval - dVar9 < *pdVar1 || local_40.boundval - dVar9 == *pdVar1) {
LAB_0029f4bc:
      local_40.boundval = dVar9;
      if ((dVar9 == dVar8) && (!NAN(dVar9) && !NAN(dVar8))) {
        return;
      }
      goto LAB_0029f4ce;
    }
  }
  else {
    dVar8 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar3];
    if ((dVar8 <= local_40.boundval) && (local_40.boundval = dVar8, iVar6 != -1)) {
      return;
    }
    dVar9 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar3];
    lVar5 = 0x2a8;
    if (dVar9 <= local_40.boundval) goto LAB_0029f4ce;
    pdVar1 = &((this->mipsolver->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
    if (dVar9 - local_40.boundval < *pdVar1 || dVar9 - local_40.boundval == *pdVar1)
    goto LAB_0029f4bc;
  }
  if (this->infeasible_ == false) {
    uVar7 = (long)(this->domchgstack_).
                  super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->domchgstack_).
                  super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                  super__Vector_impl_data._M_start;
    this->infeasible_pos = (HighsInt)(uVar7 >> 4);
    this->infeasible_ = true;
    this->infeasible_reason = (Reason)(uVar7 * 0x10000000 | 0xfffffffa);
  }
LAB_0029f4ce:
  lVar5 = *(long *)((long)&(this->changedcolsflags_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start + lVar5);
  local_2c = *(int *)(lVar5 + lVar3 * 4);
  uVar4 = (undefined4)
          ((ulong)((long)(this->domchgstack_).
                         super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->domchgstack_).
                        super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                        _M_impl.super__Vector_impl_data._M_start) >> 4);
  *(undefined4 *)(lVar5 + lVar3 * 4) = uVar4;
  local_20 = reason;
  if (iVar6 == -1) {
    local_28 = (double)CONCAT44(local_28._4_4_,uVar4);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->branchPos_,(int *)&local_28);
  }
  bVar2 = isBinary(this,boundchg.column);
  local_28 = doChangeBound(this,&local_40);
  std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
  emplace_back<double&,int&>
            ((vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)
             &this->prevboundval_,&local_28,&local_2c);
  std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::push_back
            (&this->domchgstack_,&local_40);
  std::vector<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>::push_back
            (&this->domchgreason_,&local_20);
  if ((bVar2) && (this->infeasible_ == false)) {
    dVar8 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[local_40.column];
    pdVar1 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + local_40.column;
    if ((dVar8 == *pdVar1) && (!NAN(dVar8) && !NAN(*pdVar1))) {
      HighsCliqueTable::addImplications
                (&((this->mipsolver->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->cliquetable,
                 this,local_40.column,(uint)(0.5 < dVar8));
    }
  }
  return;
}

Assistant:

void HighsDomain::changeBound(HighsDomainChange boundchg, Reason reason) {
  assert(boundchg.column >= 0);
  assert(boundchg.column < (HighsInt)col_upper_.size());
  // assert(infeasible_ == 0);
  // if (reason.type == Reason::kObjective) {
  //   if (!mipsolver->submip)
  //     printf("objective propagator changed %s bound of column %d to %g\n",
  //            boundchg.boundtype == HighsBoundType::kLower ? "lower" :
  //            "upper", boundchg.column, boundchg.boundval);
  // }

  HighsInt prevPos;
  if (boundchg.boundtype == HighsBoundType::kLower) {
    if (boundchg.boundval <= col_lower_[boundchg.column]) {
      if (reason.type != Reason::kBranching) return;
      boundchg.boundval = col_lower_[boundchg.column];
    }
    if (boundchg.boundval > col_upper_[boundchg.column]) {
      if (boundchg.boundval - col_upper_[boundchg.column] >
          mipsolver->mipdata_->feastol) {
        mipsolver->mipdata_->debugSolution.nodePruned(*this);
        if (!infeasible_) {
          infeasible_pos = domchgstack_.size();
          infeasible_ = true;
          infeasible_reason = Reason::conflictingBounds(domchgstack_.size());
        }
      } else {
        boundchg.boundval = col_upper_[boundchg.column];
        if (boundchg.boundval == col_lower_[boundchg.column]) return;
      }
    }

    prevPos = colLowerPos_[boundchg.column];
    colLowerPos_[boundchg.column] = domchgstack_.size();
  } else {
    if (boundchg.boundval >= col_upper_[boundchg.column]) {
      if (reason.type != Reason::kBranching) return;
      boundchg.boundval = col_upper_[boundchg.column];
    }
    if (boundchg.boundval < col_lower_[boundchg.column]) {
      if (col_lower_[boundchg.column] - boundchg.boundval >
          mipsolver->mipdata_->feastol) {
        mipsolver->mipdata_->debugSolution.nodePruned(*this);
        if (!infeasible_) {
          infeasible_pos = domchgstack_.size();
          infeasible_ = true;
          infeasible_reason = Reason::conflictingBounds(domchgstack_.size());
        }
      } else {
        boundchg.boundval = col_lower_[boundchg.column];
        if (boundchg.boundval == col_upper_[boundchg.column]) return;
      }
    }

    prevPos = colUpperPos_[boundchg.column];
    colUpperPos_[boundchg.column] = domchgstack_.size();
  }

  mipsolver->mipdata_->debugSolution.boundChangeAdded(
      *this, boundchg, reason.type == Reason::kBranching);

  if (reason.type == Reason::kBranching)
    branchPos_.push_back(domchgstack_.size());

  assert(prevPos < (HighsInt)domchgstack_.size());

  bool binary = isBinary(boundchg.column);

  double oldbound = doChangeBound(boundchg);

  prevboundval_.emplace_back(oldbound, prevPos);
  domchgstack_.push_back(boundchg);
  domchgreason_.push_back(reason);

  if (binary && !infeasible_ && isFixed(boundchg.column))
    mipsolver->mipdata_->cliquetable.addImplications(
        *this, boundchg.column, col_lower_[boundchg.column] > 0.5);
}